

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusxml2cpp.cpp
# Opt level: O2

Interfaces __thiscall QDBusXmlToCpp::readInput(QDBusXmlToCpp *this)

{
  QString *lhs;
  FILE *pFVar1;
  bool bVar2;
  char cVar3;
  char16_t *pcVar4;
  long in_RSI;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  QString QStack_98;
  QArrayDataPointer<char16_t> local_80;
  QArrayDataPointer<char16_t> local_68;
  undefined8 local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lhs = (QString *)(in_RSI + 0x48);
  local_48 = 0xaaaaaaaaaaaaaaaa;
  uStack_40 = 0xaaaaaaaaaaaaaaaa;
  QFile::QFile((QFile *)&local_48,(QString *)lhs);
  if (*(long *)(in_RSI + 0x58) == 0) {
LAB_001041e3:
    latin1.m_data = "<standard input>";
    latin1.m_size = 0x10;
    QString::QString((QString *)&local_68,latin1);
    QString::operator=((QString *)(in_RSI + 0xd0),(QString *)&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
    cVar3 = QFile::open(&local_48,_stdin,1,0);
    pFVar1 = _stderr;
    if (cVar3 == '\0') {
      QIODevice::errorString();
      QString::toLocal8Bit((QByteArray *)&local_68,(QString *)&local_80);
      pcVar4 = local_68.ptr;
      if (local_68.ptr == (char16_t *)0x0) {
        pcVar4 = (char16_t *)&QByteArray::_empty;
      }
      fprintf(pFVar1,"qdbusxml2cpp: could not open standard input: %s\n",pcVar4);
      QByteArray::~QByteArray((QByteArray *)&local_68);
      QString::~QString((QString *)&local_80);
      goto LAB_001043dc;
    }
  }
  else {
    local_68.d = (Data *)0x1;
    local_68.ptr = L"-";
    bVar2 = operator==(lhs,(QLatin1StringView *)&local_68);
    if (bVar2) goto LAB_001041e3;
    QString::operator=((QString *)(in_RSI + 0xd0),(QString *)lhs);
    cVar3 = QFile::open(&local_48,1);
    pFVar1 = _stderr;
    if (cVar3 == '\0') {
      QString::toLocal8Bit((QByteArray *)&local_68,lhs);
      pcVar4 = local_68.ptr;
      if (local_68.ptr == (char16_t *)0x0) {
        pcVar4 = (char16_t *)&QByteArray::_empty;
      }
      QIODevice::errorString();
      QString::toLocal8Bit((QByteArray *)&local_80,&QStack_98);
      if (local_80.ptr == (char16_t *)0x0) {
        local_80.ptr = (char16_t *)&QByteArray::_empty;
      }
      fprintf(pFVar1,"qdbusxml2cpp: could not open input file \'%s\': %s\n",pcVar4,local_80.ptr);
      QByteArray::~QByteArray((QByteArray *)&local_80);
      QString::~QString(&QStack_98);
      QByteArray::~QByteArray((QByteArray *)&local_68);
      goto LAB_001043dc;
    }
  }
  local_68.size = -0x5555555555555556;
  local_68.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_68.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  QIODevice::readAll();
  (this->globalClassName).d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  QString::fromUtf8<void>((QString *)&local_80,(QByteArray *)&local_68);
  QDBusIntrospection::parseInterfaces((QString *)this,(DiagnosticsReporter *)&local_80);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
  if (*(char *)(in_RSI + 0xe8) != '\x01') {
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_68);
    QFile::~QFile((QFile *)&local_48);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return (QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QSharedDataPointer<QDBusIntrospection::Interface>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QSharedDataPointer<QDBusIntrospection::Interface>_>_>_>_>_>
              )(QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QSharedDataPointer<QDBusIntrospection::Interface>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QSharedDataPointer<QDBusIntrospection::Interface>_>_>_>_>_>
                )this;
    }
    __stack_chk_fail();
  }
LAB_001043dc:
  exit(1);
}

Assistant:

QDBusIntrospection::Interfaces QDBusXmlToCpp::readInput()
{
    QFile input(inputFile);
    if (inputFile.isEmpty() || inputFile == "-"_L1) {
        reporter.setFileName("<standard input>"_L1);
        if (!input.open(stdin, QIODevice::ReadOnly)) {
            fprintf(stderr, PROGRAMNAME ": could not open standard input: %s\n",
                    qPrintable(input.errorString()));
            exit(1);
        }
    } else {
        reporter.setFileName(inputFile);
        if (!input.open(QIODevice::ReadOnly)) {
            fprintf(stderr, PROGRAMNAME ": could not open input file '%s': %s\n",
                    qPrintable(inputFile), qPrintable(input.errorString()));
            exit(1);
        }
    }

    QByteArray data = input.readAll();
    auto interfaces = QDBusIntrospection::parseInterfaces(QString::fromUtf8(data), &reporter);
    if (reporter.hadErrors())
        exit(1);

    return interfaces;
}